

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O2

uint32_t generateBucketId(string *typeName)

{
  bool bVar1;
  long lVar2;
  string local_40;
  
  do {
    lVar2 = random();
    generateBucketFileName(&local_40,typeName,(uint32_t)lVar2);
    bVar1 = checkFileExist(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  } while (bVar1);
  return (uint32_t)lVar2;
}

Assistant:

uint32_t generateBucketId(string &typeName) {

    bool file_exist;

    uint32_t postfix;

    do {
        postfix = random();

        file_exist = checkFileExist(generateBucketFileName(typeName, postfix));

    } while(file_exist);

    return postfix;
}